

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

int VP8EmitTokens(VP8TBuffer *b,VP8BitWriter *bw,uint8_t *probas,int final_pass)

{
  long *plVar1;
  int in_ECX;
  int iVar2;
  undefined8 *in_RDI;
  int bit;
  token_t token;
  token_t *tokens;
  int n;
  int N;
  VP8Tokens *next;
  VP8Tokens *p;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  int iVar4;
  int local_38;
  long *local_28;
  
  local_28 = (long *)*in_RDI;
  while (local_28 != (long *)0x0) {
    plVar1 = (long *)*local_28;
    if (plVar1 == (long *)0x0) {
      iVar3 = *(int *)(in_RDI + 3);
    }
    else {
      iVar3 = 0;
    }
    iVar4 = iVar3;
    local_38 = *(int *)((long)in_RDI + 0x1c);
    while (iVar2 = local_38 + -1, iVar3 < local_38) {
      local_38 = iVar2;
      if ((*(ushort *)((long)local_28 + (long)iVar2 * 2 + 8) & 0x4000) == 0) {
        VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
      else {
        VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      }
    }
    local_28 = plVar1;
    if (in_ECX != 0) {
      WebPSafeFree((void *)0x1ad2b6);
    }
  }
  if (in_ECX != 0) {
    *in_RDI = 0;
  }
  return 1;
}

Assistant:

int VP8EmitTokens(VP8TBuffer* const b, VP8BitWriter* const bw,
                  const uint8_t* const probas, int final_pass) {
  const VP8Tokens* p = b->pages_;
  assert(!b->error_);
  while (p != NULL) {
    const VP8Tokens* const next = p->next_;
    const int N = (next == NULL) ? b->left_ : 0;
    int n = b->page_size_;
    const token_t* const tokens = TOKEN_DATA(p);
    while (n-- > N) {
      const token_t token = tokens[n];
      const int bit = (token >> 15) & 1;
      if (token & FIXED_PROBA_BIT) {
        VP8PutBit(bw, bit, token & 0xffu);  // constant proba
      } else {
        VP8PutBit(bw, bit, probas[token & 0x3fffu]);
      }
    }
    if (final_pass) WebPSafeFree((void*)p);
    p = next;
  }
  if (final_pass) b->pages_ = NULL;
  return 1;
}